

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O3

Image * __thiscall aeron::Image::operator=(Image *this,Image *image)

{
  int64_t iVar1;
  int32_t iVar2;
  long lVar3;
  
  lVar3 = 0x10;
  do {
    *(undefined4 *)((long)&(this->m_termBuffers)._M_elems[0]._vptr_AtomicBuffer + lVar3) =
         *(undefined4 *)((long)&(image->m_termBuffers)._M_elems[0]._vptr_AtomicBuffer + lVar3);
    *(undefined8 *)((long)(this->m_termBuffers)._M_elems + lVar3 + -8) =
         *(undefined8 *)((long)(image->m_termBuffers)._M_elems + lVar3 + -8);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x58);
  (this->m_header).m_context = (image->m_header).m_context;
  (this->m_header).m_buffer.m_buffer = (image->m_header).m_buffer.m_buffer;
  (this->m_header).m_buffer.m_length = (image->m_header).m_buffer.m_length;
  iVar2 = (image->m_header).m_initialTermId;
  (this->m_header).m_offset = (image->m_header).m_offset;
  (this->m_header).m_initialTermId = iVar2;
  (this->m_header).m_positionBitsToShift = (image->m_header).m_positionBitsToShift;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.m_buffer =
       (image->m_subscriberPosition).
       super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.
       m_buffer;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.m_length =
       (image->m_subscriberPosition).
       super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_buffer.
       m_length;
  iVar2 = (image->m_subscriberPosition).
          super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_offset;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_id =
       (image->m_subscriberPosition).
       super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_id;
  (this->m_subscriberPosition).
  super_ReadablePosition<aeron::concurrent::status::UnsafeBufferPosition>.m_impl.m_offset = iVar2;
  (this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (image->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_logBuffers).super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             &(image->m_logBuffers).
              super___shared_ptr<aeron::LogBuffers,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::_M_assign((string *)&this->m_sourceIdentity);
  LOCK();
  (this->m_isClosed)._M_base._M_i = (__int_type)((image->m_isClosed)._M_base._M_i & 1);
  UNLOCK();
  std::function<void_(const_std::exception_&)>::operator=
            (&this->m_exceptionHandler,&image->m_exceptionHandler);
  iVar1 = image->m_subscriptionRegistrationId;
  this->m_correlationId = image->m_correlationId;
  this->m_subscriptionRegistrationId = iVar1;
  iVar1 = image->m_finalPosition;
  this->m_joinPosition = image->m_joinPosition;
  this->m_finalPosition = iVar1;
  iVar2 = image->m_termLengthMask;
  this->m_sessionId = image->m_sessionId;
  this->m_termLengthMask = iVar2;
  this->m_positionBitsToShift = image->m_positionBitsToShift;
  this->m_isEos = image->m_isEos;
  return this;
}

Assistant:

Image& operator=(const Image& image)
    {
        m_termBuffers = image.m_termBuffers;
        m_header = image.m_header;
        m_subscriberPosition = image.m_subscriberPosition;
        m_logBuffers = image.m_logBuffers;
        m_sourceIdentity = image.m_sourceIdentity;
        m_isClosed = image.isClosed();
        m_exceptionHandler = image.m_exceptionHandler;
        m_correlationId = image.m_correlationId;
        m_subscriptionRegistrationId = image.m_subscriptionRegistrationId;
        m_joinPosition = image.m_joinPosition;
        m_finalPosition = image.m_finalPosition;
        m_sessionId = image.m_sessionId;
        m_termLengthMask = image.m_termLengthMask;
        m_positionBitsToShift = image.m_positionBitsToShift;
        m_isEos = image.m_isEos;

        return *this;
    }